

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cab_manager.cpp
# Opt level: O0

void __thiscall
cab_manager::add_request(cab_manager *this,node_type src,node_type dst,uint32_t passengers)

{
  bool bVar1;
  id_type iVar2;
  ostream *poVar3;
  element_type *peVar4;
  undefined1 local_28 [8];
  shared_ptr<cab> cab;
  uint32_t passengers_local;
  node_type dst_local;
  node_type src_local;
  cab_manager *this_local;
  
  cab.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = passengers;
  cab.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = dst;
  cab.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = src;
  find_cab((cab_manager *)local_28,(node_type)this,src,(uint)dst);
  bVar1 = std::operator==((shared_ptr<cab> *)local_28,(nullptr_t)0x0);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"found no cab for request ");
    poVar3 = ::operator<<(poVar3,cab.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                                 ._M_pi._7_1_);
    poVar3 = std::operator<<(poVar3," --> ");
    poVar3 = ::operator<<(poVar3,cab.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                                 ._M_pi._6_1_);
    std::operator<<(poVar3,'\n');
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"found cab with id ");
    peVar4 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    iVar2 = ::cab::id(peVar4);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3," for request ");
    poVar3 = ::operator<<(poVar3,cab.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                                 ._M_pi._7_1_);
    poVar3 = std::operator<<(poVar3," --> ");
    poVar3 = ::operator<<(poVar3,cab.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                                 ._M_pi._6_1_);
    std::operator<<(poVar3,'\n');
    peVar4 = std::__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<cab,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_28);
    ::cab::add_request(peVar4,cab.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                              _M_pi._7_1_,
                       cab.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
                       _6_1_,(uint32_t)
                             cab.super___shared_ptr<cab,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi);
  }
  std::shared_ptr<cab>::~shared_ptr((shared_ptr<cab> *)local_28);
  return;
}

Assistant:

void cab_manager::add_request(node_type src, node_type dst, std::uint32_t passengers)
{
    std::shared_ptr<cab> cab = find_cab(src, dst, passengers);
    if(cab == nullptr)
    {
        std::cout << "found no cab for request " << src << " --> " << dst << '\n';
        return;
    }

    std::cout << "found cab with id " << cab->id() << " for request " << src << " --> " << dst << '\n';
    cab->add_request(src, dst, passengers);
}